

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

DVector2 __thiscall AActor::Vec2Angle(AActor *this,double length,DAngle *angle,bool absolute)

{
  double dVar1;
  double *pdVar2;
  int in_ECX;
  undefined7 in_register_00000011;
  double dVar3;
  PClass *pPVar4;
  double dVar5;
  double dVar6;
  _func_int **pp_Var7;
  DVector2 DVar8;
  
  pdVar2 = (double *)CONCAT71(in_register_00000011,absolute);
  dVar1 = angle[9].Degrees;
  if (in_ECX == 0) {
    dVar3 = angle[10].Degrees;
    dVar5 = FFastTrig::cos(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    dVar6 = FFastTrig::sin(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    DVar8 = P_GetOffsetPosition(dVar1,dVar3,dVar5 * length,length * dVar6);
  }
  else {
    dVar3 = FFastTrig::cos(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    pp_Var7 = (_func_int **)(dVar1 + dVar3 * length);
    dVar1 = angle[10].Degrees;
    dVar3 = FFastTrig::sin(&fasttrig,*pdVar2 * 11930464.711111112 + 6755399441055744.0);
    pPVar4 = (PClass *)(dVar3 * length + dVar1);
    DVar8.Y = (double)pp_Var7;
    DVar8.X = (double)pPVar4;
    (this->super_DThinker).super_DObject._vptr_DObject = pp_Var7;
    (this->super_DThinker).super_DObject.Class = pPVar4;
  }
  return DVar8;
}

Assistant:

DVector2 Vec2Angle(double length, DAngle angle, bool absolute = false)
	{
		if (absolute)
		{
			return{ X() + length * angle.Cos(), Y() + length * angle.Sin() };
		}
		else
		{
			return P_GetOffsetPosition(X(), Y(), length*angle.Cos(), length*angle.Sin());
		}
	}